

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

uint8_t * get_buf_by_bd(MACROBLOCKD *xd,uint8_t *buf16)

{
  uint8_t *local_18;
  uint8_t *buf16_local;
  MACROBLOCKD *xd_local;
  
  local_18 = buf16;
  if ((xd->cur_buf->flags & 8U) != 0) {
    local_18 = (uint8_t *)((ulong)buf16 >> 1);
  }
  return local_18;
}

Assistant:

static inline uint8_t *get_buf_by_bd(const MACROBLOCKD *xd, uint8_t *buf16) {
#if CONFIG_AV1_HIGHBITDEPTH
  return (xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH)
             ? CONVERT_TO_BYTEPTR(buf16)
             : buf16;
#else
  (void)xd;
  return buf16;
#endif
}